

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-test.c++
# Opt level: O0

void __thiscall kj::_::anon_unknown_0::TestCase183::run(TestCase183 *this)

{
  bool bVar1;
  Stringable local_59;
  String local_58;
  bool local_3d;
  bool _kj_shouldLog;
  Stringable local_29;
  String local_28;
  TestCase183 *local_10;
  TestCase183 *this_local;
  
  local_10 = this;
  str<kj::_::(anonymous_namespace)::Stringable>(&local_28,&local_29);
  bVar1 = kj::operator==("foo",&local_28);
  String::~String(&local_28);
  if (!bVar1) {
    local_3d = Debug::shouldLog(ERROR);
    while (local_3d != false) {
      str<kj::_::(anonymous_namespace)::Stringable>(&local_58,&local_59);
      Debug::log<char_const(&)[52],char_const(&)[4],kj::String>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string-test.c++"
                 ,0xb8,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (kj::str(Stringable()))\", \"foo\", kj::str(Stringable())"
                 ,(char (*) [52])"failed: expected (\"foo\") == (kj::str(Stringable()))",
                 (char (*) [4])0x266a2a,&local_58);
      String::~String(&local_58);
      local_3d = false;
    }
  }
  return;
}

Assistant:

TEST(String, ToString) {
  EXPECT_EQ("foo", kj::str(Stringable()));
}